

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::MergeFrom
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  CustomLayerParams_CustomLayerParamValue *pCVar1;
  bool bVar2;
  ValueCase VVar3;
  int32_t value;
  LogMessage *other;
  string *value_00;
  Arena *pAVar4;
  int64_t value_01;
  double value_02;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  CustomLayerParams_CustomLayerParamValue *local_28;
  CustomLayerParams_CustomLayerParamValue *from_local;
  CustomLayerParams_CustomLayerParamValue *this_local;
  CustomLayerParams_CustomLayerParamValue *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x921e);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  VVar3 = value_case(local_28);
  switch(VVar3) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    value_02 = _internal_doublevalue(local_28);
    _internal_set_doublevalue(this,value_02);
    break;
  case kStringValue:
    this_local = (CustomLayerParams_CustomLayerParamValue *)
                 _internal_stringvalue_abi_cxx11_(local_28);
    local_10 = this;
    bVar2 = _internal_has_stringvalue(this);
    if (!bVar2) {
      clear_value(this);
      set_has_stringvalue(this);
      value_00 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->value_).stringvalue_,value_00);
    }
    pCVar1 = this_local;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,pCVar1,pAVar4);
    break;
  case kIntValue:
    value = _internal_intvalue(local_28);
    _internal_set_intvalue(this,value);
    break;
  case kLongValue:
    value_01 = _internal_longvalue(local_28);
    _internal_set_longvalue(this,value_01);
    break;
  case kBoolValue:
    bVar2 = _internal_boolvalue(local_28);
    _internal_set_boolvalue(this,bVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::MergeFrom(const CustomLayerParams_CustomLayerParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}